

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.hpp
# Opt level: O3

void __thiscall helics::PublicationInfo::~PublicationInfo(PublicationInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte *pbVar3;
  
  pcVar2 = (this->destTargets)._M_dataplus._M_p;
  paVar1 = &(this->destTargets).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if ((((this->data).usingAllocatedBuffer == true) && ((this->data).nonOwning == false)) &&
     (pbVar3 = (this->data).heap, pbVar3 != (byte *)0x0)) {
    operator_delete__(pbVar3);
  }
  pcVar2 = (this->units)._M_dataplus._M_p;
  paVar1 = &(this->units).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->type)._M_dataplus._M_p;
  paVar1 = &(this->type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->key)._M_dataplus._M_p;
  paVar1 = &(this->key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  ~vector(&this->subscribers);
  return;
}

Assistant:

PublicationInfo(GlobalHandle pid,
                    std::string_view pkey,
                    std::string_view ptype,
                    std::string_view punits): id(pid), key(pkey), type(ptype), units(punits)
    {
    }